

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_gameboard.cpp
# Opt level: O2

void GameBoard::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  code *pcVar2;
  long lVar3;
  QArrayDataPointer<char16_t> local_20;
  
  if (_c == IndexOfMethod) {
    pcVar2 = *_a[1];
    lVar3 = *(long *)((long)_a[1] + 8);
    if (pcVar2 == setTextOnFields && lVar3 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar2 == gameOver && lVar3 == 0) {
      *(undefined4 *)*_a = 1;
    }
  }
  else if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      plVar1 = (long *)_a[1];
      local_20.d = (Data *)*plVar1;
      local_20.ptr = (char16_t *)plVar1[1];
      local_20.size = plVar1[2];
      if (local_20.d != (Data *)0x0) {
        LOCK();
        ((local_20.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_20.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      setTextOnFields((GameBoard *)_o,(QString *)&local_20);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_20);
      break;
    case 1:
      gameOver((GameBoard *)_o,*_a[1]);
      return;
    case 2:
      beginNewGame((GameBoard *)_o);
      return;
    case 3:
      handleButtonClick((GameBoard *)_o,*_a[1],*_a[2]);
      return;
    }
  }
  return;
}

Assistant:

void GameBoard::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<GameBoard *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->setTextOnFields((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 1: _t->gameOver((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->beginNewGame(); break;
        case 3: _t->handleButtonClick((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (GameBoard::*)(QString );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&GameBoard::setTextOnFields)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (GameBoard::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&GameBoard::gameOver)) {
                *result = 1;
                return;
            }
        }
    }
}